

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O0

uint32_t ClosestDiscretizedArgb(uint32_t a,int bits)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int in_ESI;
  uint in_EDI;
  
  uVar1 = FindClosestDiscretized(in_EDI >> 0x18,in_ESI);
  uVar2 = FindClosestDiscretized(in_EDI >> 0x10 & 0xff,in_ESI);
  uVar3 = FindClosestDiscretized(in_EDI >> 8 & 0xff,in_ESI);
  uVar4 = FindClosestDiscretized(in_EDI & 0xff,in_ESI);
  return uVar1 << 0x18 | uVar2 << 0x10 | uVar3 << 8 | uVar4;
}

Assistant:

static uint32_t ClosestDiscretizedArgb(uint32_t a, int bits) {
  return
      (FindClosestDiscretized(a >> 24, bits) << 24) |
      (FindClosestDiscretized((a >> 16) & 0xff, bits) << 16) |
      (FindClosestDiscretized((a >> 8) & 0xff, bits) << 8) |
      (FindClosestDiscretized(a & 0xff, bits));
}